

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall hwnet::Buffer::Buffer(Buffer *this,size_t cap_,size_t l)

{
  shared_ptr<hwnet::Buffer::bytes> local_30;
  ulong local_20;
  size_t l_local;
  size_t cap__local;
  Buffer *this_local;
  
  local_20 = l;
  l_local = cap_;
  cap__local = (size_t)this;
  std::shared_ptr<hwnet::Buffer::bytes>::shared_ptr(&this->buff);
  this->b = 0;
  this->len = 0;
  if (l_local < 0x10) {
    l_local = 0x10;
  }
  if (l_local < local_20) {
    local_20 = l_local;
  }
  std::make_shared<hwnet::Buffer::bytes,unsigned_long&>((unsigned_long *)&local_30);
  std::shared_ptr<hwnet::Buffer::bytes>::operator=(&this->buff,&local_30);
  std::shared_ptr<hwnet::Buffer::bytes>::~shared_ptr(&local_30);
  this->cap = l_local;
  this->len = local_20;
  return;
}

Assistant:

Buffer(size_t cap_,size_t l):b(0),len(0){
		if(cap_ < 16) {
			cap_ = 16;
		}
		
		if(l > cap_) {
			l = cap_;
		}

		this->buff = std::make_shared<bytes>(cap_);
		this->cap  = cap_;
		this->len  = l;
	}